

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O0

int MeCab::load_request_type(Param *param)

{
  bool bVar1;
  int iVar2;
  int lattice_level;
  int nbest;
  int request_type;
  char *in_stack_000000a0;
  Param *in_stack_000000a8;
  undefined4 local_c;
  
  local_c = 1;
  bVar1 = Param::get<bool>(in_stack_000000a8,in_stack_000000a0);
  if (bVar1) {
    local_c = 0x41;
  }
  bVar1 = Param::get<bool>(in_stack_000000a8,in_stack_000000a0);
  if (bVar1) {
    local_c = local_c | 4;
  }
  bVar1 = Param::get<bool>(in_stack_000000a8,in_stack_000000a0);
  if (bVar1) {
    local_c = local_c | 0x20;
  }
  bVar1 = Param::get<bool>(in_stack_000000a8,in_stack_000000a0);
  if (bVar1) {
    local_c = local_c | 8;
  }
  iVar2 = Param::get<int>(in_stack_000000a8,in_stack_000000a0);
  if (1 < iVar2) {
    local_c = local_c | 2;
  }
  iVar2 = Param::get<int>(in_stack_000000a8,in_stack_000000a0);
  if (0 < iVar2) {
    local_c = local_c | 2;
  }
  if (1 < iVar2) {
    local_c = local_c | 8;
  }
  return local_c;
}

Assistant:

int load_request_type(const Param &param) {
  int request_type = MECAB_ONE_BEST;

  if (param.get<bool>("allocate-sentence")) {
    request_type |= MECAB_ALLOCATE_SENTENCE;
  }

  if (param.get<bool>("partial")) {
    request_type |= MECAB_PARTIAL;
  }

  if (param.get<bool>("all-morphs")) {
    request_type |= MECAB_ALL_MORPHS;
  }

  if (param.get<bool>("marginal")) {
    request_type |= MECAB_MARGINAL_PROB;
  }

  const int nbest = param.get<int>("nbest");
  if (nbest >= 2) {
    request_type |= MECAB_NBEST;
  }

  // DEPRECATED:
  const int lattice_level = param.get<int>("lattice-level");
  if (lattice_level >= 1) {
    request_type |= MECAB_NBEST;
  }

  if (lattice_level >= 2) {
    request_type |= MECAB_MARGINAL_PROB;
  }

  return request_type;
}